

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O1

void __thiscall
mocker::ir::BuilderContext::emplaceInst<mocker::ir::Comment,char_const(&)[1]>
          (BuilderContext *this,char (*args) [1])

{
  shared_ptr<mocker::ir::Comment> inst;
  undefined1 local_31;
  Comment *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  shared_ptr<mocker::ir::IRInst> local_20;
  
  local_30 = (Comment *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Comment,std::allocator<mocker::ir::Comment>,char_const(&)[1]>
            (&_Stack_28,&local_30,(allocator<mocker::ir::Comment> *)&local_31,args);
  local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_30->super_IRInst;
  local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  local_30 = (Comment *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  appendInst(this,&local_20);
  if (local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_28._M_pi);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }